

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O3

ssize_t get_line(uchar *b,ssize_t avail,ssize_t *nlsize)

{
  byte bVar1;
  long lVar2;
  
  if (0 < avail) {
    lVar2 = 0;
    do {
      bVar1 = ""[*b];
      if (bVar1 < 10) {
        if (bVar1 == 1) {
          b = b + 1;
          lVar2 = lVar2 + 1;
        }
        else if (bVar1 == 0) {
          avail = -1;
          break;
        }
      }
      else {
        if (bVar1 == 10) {
LAB_00129598:
          if (nlsize != (ssize_t *)0x0) {
            *nlsize = 1;
          }
          return lVar2 + 1;
        }
        if (bVar1 == 0xd) {
          if ((1 < avail - lVar2) && (b[1] == 10)) {
            if (nlsize != (ssize_t *)0x0) {
              *nlsize = 2;
            }
            return lVar2 + 2;
          }
          goto LAB_00129598;
        }
      }
    } while (lVar2 < avail);
  }
  if (nlsize != (ssize_t *)0x0) {
    *nlsize = 0;
  }
  return avail;
}

Assistant:

static ssize_t
get_line(const unsigned char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (ascii[*b]) {
		case 0:	/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		case 1:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}